

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O3

void Imath_2_5::jacobiEigenSolver<double>
               (Matrix33<double> *A,Vec3<double> *S,Matrix33<double> *V,double tol)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  double *pdVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double local_28 [4];
  
  V->x[1][0] = 0.0;
  V->x[1][1] = 0.0;
  V->x[1][2] = 0.0;
  V->x[2][0] = 0.0;
  V->x[0][1] = 0.0;
  V->x[0][2] = 0.0;
  V->x[2][1] = 0.0;
  V->x[0][0] = 1.0;
  V->x[1][1] = 1.0;
  V->x[2][2] = 1.0;
  lVar3 = 0;
  do {
    *(undefined8 *)((long)&S->x + lVar3) = *(undefined8 *)((long)A->x[0] + lVar3 * 4);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x18);
  dVar9 = 0.0;
  uVar4 = 0;
  pdVar5 = (double *)A;
  do {
    if (uVar4 < 2) {
      lVar3 = 1;
      do {
        dVar12 = ABS(pdVar5[lVar3]);
        if (ABS(pdVar5[lVar3]) <= dVar9) {
          dVar12 = dVar9;
        }
        dVar9 = dVar12;
        lVar1 = uVar4 + lVar3;
        lVar3 = lVar3 + 1;
      } while (lVar1 != 2);
    }
    uVar4 = uVar4 + 1;
    pdVar5 = pdVar5 + 4;
  } while (uVar4 != 3);
  dVar9 = dVar9 * tol;
  if ((dVar9 != 0.0) || (NAN(dVar9))) {
    uVar2 = 0;
    while( true ) {
      local_28[0] = 0.0;
      local_28[1] = 0.0;
      local_28[2] = 0.0;
      dVar10 = A->x[0][0];
      dVar12 = A->x[0][1];
      dVar11 = A->x[1][1];
      dVar7 = dVar11 - dVar10;
      dVar15 = ABS(dVar12 + dVar12);
      dVar16 = ABS(dVar7) * tol;
      if (dVar15 <= dVar16) {
        A->x[0][1] = 0.0;
        local_28[3] = 0.0;
        local_28[0] = 0.0;
      }
      else {
        dVar7 = dVar7 / (dVar12 + dVar12);
        dVar7 = *(double *)(&DAT_00167cc0 + (ulong)(dVar7 < 0.0) * 8) /
                (SQRT(dVar7 * dVar7 + 1.0) + ABS(dVar7));
        dVar13 = 1.0 / SQRT(dVar7 * dVar7 + 1.0);
        dVar12 = dVar12 * dVar7;
        dVar7 = dVar7 * dVar13;
        dVar13 = dVar7 / (dVar13 + 1.0);
        local_28[0] = 0.0 - dVar12;
        local_28[3] = dVar12 + 0.0;
        local_28[1] = local_28[3];
        A->x[0][0] = dVar10 - dVar12;
        A->x[1][1] = dVar11 + dVar12;
        A->x[0][1] = 0.0;
        dVar12 = A->x[0][2];
        dVar11 = A->x[1][2];
        A->x[0][2] = dVar12 - (dVar13 * dVar12 + dVar11) * dVar7;
        A->x[1][2] = (dVar12 - dVar13 * dVar11) * dVar7 + dVar11;
        lVar3 = 0;
        do {
          pdVar5 = (double *)((long)V->x[0] + lVar3);
          dVar12 = *pdVar5;
          dVar11 = pdVar5[1];
          pdVar5 = (double *)((long)V->x[0] + lVar3);
          *pdVar5 = (dVar13 * dVar12 + dVar11) * -dVar7 + dVar12;
          pdVar5[1] = (-dVar13 * dVar11 + dVar12) * dVar7 + dVar11;
          lVar3 = lVar3 + 0x18;
        } while (lVar3 != 0x48);
        dVar10 = A->x[0][0];
      }
      dVar12 = A->x[0][2];
      dVar11 = A->x[2][2];
      dVar7 = ABS(dVar12 + dVar12);
      dVar13 = ABS(dVar11 - dVar10) * tol;
      if (dVar7 <= dVar13) {
        A->x[0][2] = 0.0;
        local_28[2] = 0.0;
      }
      else {
        dVar8 = (dVar11 - dVar10) / (dVar12 + dVar12);
        dVar17 = *(double *)(&DAT_00167cc0 + (ulong)(dVar8 < 0.0) * 8) /
                 (SQRT(dVar8 * dVar8 + 1.0) + ABS(dVar8));
        dVar8 = 1.0 / SQRT(dVar17 * dVar17 + 1.0);
        dVar12 = dVar12 * dVar17;
        dVar17 = dVar17 * dVar8;
        dVar8 = dVar17 / (dVar8 + 1.0);
        local_28[0] = local_28[0] - dVar12;
        local_28[2] = dVar12 + 0.0;
        A->x[0][0] = dVar10 - dVar12;
        A->x[2][2] = dVar11 + dVar12;
        A->x[0][2] = 0.0;
        dVar12 = A->x[0][1];
        dVar11 = A->x[1][2];
        A->x[0][1] = dVar12 - (dVar8 * dVar12 + dVar11) * dVar17;
        A->x[1][2] = (dVar12 - dVar8 * dVar11) * dVar17 + dVar11;
        lVar3 = 0x10;
        do {
          dVar12 = *(double *)((long)(V->x + -1) + 8 + lVar3);
          dVar11 = *(double *)((long)V->x[0] + lVar3);
          *(double *)((long)(V->x + -1) + 8 + lVar3) = (dVar8 * dVar12 + dVar11) * -dVar17 + dVar12;
          *(double *)((long)V->x[0] + lVar3) = (-dVar8 * dVar11 + dVar12) * dVar17 + dVar11;
          lVar3 = lVar3 + 0x18;
        } while (lVar3 != 0x58);
        dVar11 = A->x[2][2];
      }
      dVar12 = A->x[1][1];
      dVar10 = A->x[1][2];
      dVar17 = dVar11 - dVar12;
      dVar18 = ABS(dVar10 + dVar10);
      dVar8 = ABS(dVar17) * tol;
      if (dVar18 <= dVar8) {
        A->x[1][2] = 0.0;
      }
      else {
        dVar17 = dVar17 / (dVar10 + dVar10);
        dVar17 = *(double *)(&DAT_00167cc0 + (ulong)(dVar17 < 0.0) * 8) /
                 (SQRT(dVar17 * dVar17 + 1.0) + ABS(dVar17));
        dVar14 = 1.0 / SQRT(dVar17 * dVar17 + 1.0);
        dVar10 = dVar10 * dVar17;
        dVar17 = dVar17 * dVar14;
        dVar14 = dVar17 / (dVar14 + 1.0);
        local_28[1] = local_28[3] - dVar10;
        local_28[2] = local_28[2] + dVar10;
        A->x[1][1] = dVar12 - dVar10;
        A->x[2][2] = dVar11 + dVar10;
        A->x[1][2] = 0.0;
        dVar12 = A->x[0][1];
        dVar11 = A->x[0][2];
        A->x[0][1] = (dVar14 * dVar12 + dVar11) * -dVar17 + dVar12;
        A->x[0][2] = (-dVar14 * dVar11 + dVar12) * dVar17 + dVar11;
        lVar3 = 8;
        do {
          pdVar5 = (double *)((long)V->x[0] + lVar3);
          dVar12 = *pdVar5;
          dVar11 = pdVar5[1];
          pdVar5 = (double *)((long)V->x[0] + lVar3);
          *pdVar5 = (dVar14 * dVar12 + dVar11) * -dVar17 + dVar12;
          pdVar5[1] = (-dVar14 * dVar11 + dVar12) * dVar17 + dVar11;
          lVar3 = lVar3 + 0x18;
        } while (lVar3 != 0x50);
      }
      lVar3 = 0;
      do {
        dVar12 = *(double *)((long)local_28 + lVar3) + *(double *)((long)&S->x + lVar3);
        *(double *)((long)&S->x + lVar3) = dVar12;
        *(double *)((long)A->x[0] + lVar3 * 4) = dVar12;
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x18);
      if ((bool)(~(dVar16 < dVar15 || dVar13 < dVar7) & dVar18 <= dVar8)) break;
      dVar12 = 0.0;
      uVar4 = 0;
      pdVar5 = (double *)A;
      do {
        if (uVar4 < 2) {
          lVar3 = 1;
          dVar11 = dVar12;
          do {
            dVar12 = ABS(pdVar5[lVar3]);
            if (ABS(pdVar5[lVar3]) <= dVar11) {
              dVar12 = dVar11;
            }
            lVar1 = uVar4 + lVar3;
            lVar3 = lVar3 + 1;
            dVar11 = dVar12;
          } while (lVar1 != 2);
        }
        uVar4 = uVar4 + 1;
        pdVar5 = pdVar5 + 4;
      } while (uVar4 != 3);
      if (dVar12 <= dVar9) {
        return;
      }
      bVar6 = 0x12 < uVar2;
      uVar2 = uVar2 + 1;
      if (bVar6) {
        return;
      }
    }
  }
  return;
}

Assistant:

void
jacobiEigenSolver (Matrix33<T>& A,
                   Vec3<T>& S,
                   Matrix33<T>& V,
                   const T tol)
{
    V.makeIdentity();
    for(int i = 0; i < 3; ++i) {
        S[i] = A[i][i];
    }

    const int maxIter = 20;  // In case we get really unlucky, prevents infinite loops
    const T absTol = tol * maxOffDiagSymm (A);  // Tolerance is in terms of the maximum
    if (absTol != 0)                        // _off-diagonal_ entry.
    {
        int numIter = 0;
        do
        {
            // Z is for accumulating small changes (h) to diagonal entries
            // of A for one sweep. Adding h's directly to A might cause
            // a cancellation effect when h is relatively very small to 
            // the corresponding diagonal entry of A and 
            // this will increase numerical errors
            Vec3<T> Z(0, 0, 0);
            ++numIter;
            bool changed = jacobiRotation<0, 1, 2> (A, V, Z, tol);
            changed = jacobiRotation<0, 2, 1> (A, V, Z, tol) || changed;
            changed = jacobiRotation<1, 2, 0> (A, V, Z, tol) || changed;
            // One sweep passed. Add accumulated changes (Z) to singular values (S)
            // Update diagonal elements of A for better accuracy as well.
            for(int i = 0; i < 3; ++i) {
                A[i][i] = S[i] += Z[i];
            }
            if (!changed)
                break;
        } while (maxOffDiagSymm(A) > absTol && numIter < maxIter);
    }
}